

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurve::IfcDimensionCurve(IfcDimensionCurve *this)

{
  IfcDimensionCurve *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcAnnotationCurveOccurrence).field_0xa0,"IfcDimensionCurve");
  IfcAnnotationCurveOccurrence::IfcAnnotationCurveOccurrence
            (&this->super_IfcAnnotationCurveOccurrence,&PTR_construction_vtable_24__00fdf030);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurve,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurve,_0UL> *)
             &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.field_0x90,
             &PTR_construction_vtable_24__00fdf0e0);
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem =
       0xfdef50;
  *(undefined8 *)&(this->super_IfcAnnotationCurveOccurrence).field_0xa0 = 0xfdf018;
  (this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0xfdef78;
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x70 = 0xfdefa0;
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x80 = 0xfdefc8;
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.field_0x90 = 0xfdeff0;
  return;
}

Assistant:

IfcDimensionCurve() : Object("IfcDimensionCurve") {}